

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

HighsStatus extractTriangularHessian(HighsOptions *options,HighsHessian *hessian)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  pointer pdVar4;
  HighsStatus HVar5;
  ulong uVar6;
  pointer piVar7;
  HighsInt nnz0;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  uVar1 = hessian->dim_;
  piVar7 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  uVar6 = 0;
  iVar8 = 0;
  while (uVar6 != uVar9) {
    piVar3 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = iVar8;
    for (lVar10 = (long)piVar7[uVar6]; lVar10 < piVar7[uVar6 + 1]; lVar10 = lVar10 + 1) {
      uVar2 = piVar3[lVar10];
      if ((long)uVar6 <= (long)(int)uVar2) {
        piVar3[iVar11] = uVar2;
        pdVar4[iVar11] = pdVar4[lVar10];
        if (iVar8 < iVar11 && uVar6 == uVar2) {
          piVar3[iVar11] = piVar3[iVar8];
          pdVar4[iVar11] = pdVar4[iVar8];
          piVar3[iVar8] = uVar2;
          pdVar4[iVar8] = pdVar4[lVar10];
        }
        iVar11 = iVar11 + 1;
      }
    }
    piVar7[uVar6] = iVar8;
    uVar6 = uVar6 + 1;
    iVar8 = iVar11;
  }
  HVar5 = kOk;
  if (piVar7[(int)uVar1] != iVar8) {
    bVar12 = hessian->format_ == kTriangular;
    if (bVar12) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                   "Ignored %d entries of Hessian in opposite triangle\n");
      piVar7 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    HVar5 = (HighsStatus)bVar12;
    piVar7[(int)uVar1] = iVar8;
  }
  hessian->format_ = kTriangular;
  return HVar5;
}

Assistant:

HighsStatus extractTriangularHessian(const HighsOptions& options,
                                     HighsHessian& hessian) {
  // Viewing the Hessian column-wise, remove any entries in the strict
  // upper triangle
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  HighsInt nnz = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    const HighsInt nnz0 = nnz;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      if (iRow < iCol) continue;
      hessian.index_[nnz] = iRow;
      hessian.value_[nnz] = hessian.value_[iEl];
      if (iRow == iCol && nnz > nnz0) {
        // Diagonal entry is not first in column so swap it in
        hessian.index_[nnz] = hessian.index_[nnz0];
        hessian.value_[nnz] = hessian.value_[nnz0];
        hessian.index_[nnz0] = iRow;
        hessian.value_[nnz0] = hessian.value_[iEl];
      }
      nnz++;
    }
    hessian.start_[iCol] = nnz0;
  }
  const HighsInt num_ignored_nz = hessian.start_[dim] - nnz;
  assert(num_ignored_nz >= 0);
  if (num_ignored_nz) {
    if (hessian.format_ == HessianFormat::kTriangular) {
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Ignored %" HIGHSINT_FORMAT
                   " entries of Hessian in opposite triangle\n",
                   num_ignored_nz);
      return_status = HighsStatus::kWarning;
    }
    hessian.start_[dim] = nnz;
  }
  assert(hessian.start_[dim] == nnz);
  hessian.format_ = HessianFormat::kTriangular;
  return return_status;
}